

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreePrevious(BtCursor *pCur,int flags)

{
  char *in_RDI;
  int local_4;
  
  in_RDI[1] = in_RDI[1] & 0xf1;
  in_RDI[0x46] = '\0';
  in_RDI[0x47] = '\0';
  if (((*in_RDI == '\0') && (*(short *)(in_RDI + 0x56) != 0)) &&
     (*(char *)(*(long *)(in_RDI + 0x88) + 8) != '\0')) {
    *(short *)(in_RDI + 0x56) = *(short *)(in_RDI + 0x56) + -1;
    local_4 = 0;
  }
  else {
    local_4 = btreePrevious(pCur);
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int flags){
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->ix==0
   || pCur->pPage->leaf==0
  ){
    return btreePrevious(pCur);
  }
  pCur->ix--;
  return SQLITE_OK;
}